

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

void serialPrintf(int fd,char *message,...)

{
  char local_438 [8];
  char buffer [1024];
  va_list argp;
  char *message_local;
  int fd_local;
  
  buffer[0x3fc] = '0';
  buffer[0x3fd] = '\0';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  buffer[0x3f8] = '\x10';
  buffer[0x3f9] = '\0';
  buffer[0x3fa] = '\0';
  buffer[0x3fb] = '\0';
  vsnprintf(local_438,0x3ff,message,buffer + 0x3f8);
  serialPuts(fd,local_438);
  return;
}

Assistant:

void serialPrintf(const int fd, const char *message, ...)
{
	va_list argp;
	char buffer[1024];

	va_start(argp, message);
	vsnprintf(buffer, 1023, message, argp);
	va_end(argp);

	serialPuts(fd, buffer);
}